

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O2

int Abc_NtkRenodeEvalSop(If_Man_t *p,If_Cut_t *pCut)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint *puTruth;
  ulong uVar4;
  
  bVar1 = pCut->field_0x1f;
  for (uVar4 = 0; bVar1 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined1 *)((long)&pCut[1].Area + uVar4 + (ulong)bVar1 * 4) = 1;
  }
  puTruth = If_CutTruth(p,pCut);
  uVar2 = Kit_TruthIsop(puTruth,(uint)(byte)pCut->field_0x1f,s_vMemory,1);
  if (uVar2 == 0xffffffff) {
    iVar3 = 0xfff;
  }
  else {
    if (1 < uVar2) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,0xee,"int Abc_NtkRenodeEvalSop(If_Man_t *, If_Cut_t *)");
    }
    iVar3 = s_vMemory->nSize;
  }
  return iVar3;
}

Assistant:

int Abc_NtkRenodeEvalSop( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int i, RetValue;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = 1;
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 1 );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    return Vec_IntSize( s_vMemory );
}